

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O0

void __thiscall Hand::~Hand(Hand *this)

{
  vector<CardType,_std::allocator<CardType>_> *this_00;
  Hand *this_local;
  
  this_00 = this->handPointer;
  if (this_00 != (vector<CardType,_std::allocator<CardType>_> *)0x0) {
    std::vector<CardType,_std::allocator<CardType>_>::~vector(this_00);
    operator_delete(this_00,0x18);
  }
  return;
}

Assistant:

Hand::~Hand() {
    delete handPointer;
}